

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

KFLOAT32 __thiscall KDIS::DATA_TYPE::Vector::GetDistance(Vector *this,Vector *Other)

{
  KFLOAT32 KVar1;
  undefined1 local_30 [8];
  Vector v;
  Vector *Other_local;
  Vector *this_local;
  
  v._16_8_ = Other;
  operator-((Vector *)local_30,this,Other);
  KVar1 = GetMagnitude((Vector *)local_30);
  ~Vector((Vector *)local_30);
  return KVar1;
}

Assistant:

KFLOAT32 Vector::GetDistance( const Vector & Other )
{
    Vector v = *this - Other;
    return v.GetMagnitude();
}